

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::ClearConstraints
          (InverseKinematicsConstraintSet *this)

{
  size_type sVar1;
  long in_RDI;
  uint i;
  uint size;
  undefined4 local_10;
  
  sVar1 = std::
          vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
          ::size((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                  *)(in_RDI + 0x78));
  for (local_10 = 0; local_10 < (uint)sVar1; local_10 = local_10 + 1) {
    std::
    vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
    ::pop_back((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                *)0x85ab5e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x85ab6e);
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::pop_back
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)0x85ab7e);
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::pop_back
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)0x85ab8e);
    std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::pop_back
              ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)0x85ab9e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x85abae);
    std::vector<float,_std::allocator<float>_>::pop_back
              ((vector<float,_std::allocator<float>_> *)0x85abbe);
  }
  *(undefined4 *)(in_RDI + 0x40) = 0;
  sVar1 = std::
          vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
          ::size((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                  *)(in_RDI + 0x78));
  return (uint)sVar1;
}

Assistant:

RBDL_DLLAPI
unsigned int InverseKinematicsConstraintSet::ClearConstraints()
{
  unsigned int size = constraint_type.size();
  for (unsigned int i = 0; i < size; i++){
    constraint_type.pop_back();
    body_ids.pop_back();
    body_points.pop_back();
    target_positions.pop_back();
    target_orientations.pop_back();
    constraint_row_index.pop_back();
    constraint_weight.pop_back();    
  }
  num_constraints = 0;
  return constraint_type.size();
}